

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_lookup.c
# Opt level: O2

int64_t group_lookup(void *d,char *name,int64_t g)

{
  int iVar1;
  int64_t iVar2;
  
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_lookup.c"
                      ,L'+',(long)*d,"*mp",0x13579,"0x13579",(void *)0x0);
  iVar1 = strcmp(name,"FOOGROUP");
  iVar2 = 1;
  if (iVar1 == 0) {
    iVar2 = 0x49;
  }
  return iVar2;
}

Assistant:

static int64_t
group_lookup(void *d, const char *name, int64_t g)
{
	int *mp = d;

	(void)g; /* UNUSED */

	assertEqualInt(*mp, 0x13579);
	if (strcmp(name, "FOOGROUP"))
		return (1);
	return (73);
}